

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

bool re2::IsMatch(Prog *prog,Inst *ip)

{
  Inst *this;
  InstOp IVar1;
  int id;
  ostream *poVar2;
  LogMessage local_1a0;
  Inst *local_20;
  Inst *ip_local;
  Prog *prog_local;
  
  local_20 = ip;
  ip_local = (Inst *)prog;
  do {
    IVar1 = Prog::Inst::opcode(local_20);
    this = ip_local;
    if (IVar1 < kInstCapture) {
      return false;
    }
    if (IVar1 != kInstCapture) {
      if (IVar1 == kInstEmptyWidth) {
        return false;
      }
      if (IVar1 == kInstMatch) {
        return true;
      }
      if (IVar1 != kInstNop) {
        if (IVar1 == kInstFail) {
          return false;
        }
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.cc",
                   0x105);
        poVar2 = LogMessage::stream(&local_1a0);
        poVar2 = std::operator<<(poVar2,"Unexpected opcode in IsMatch: ");
        IVar1 = Prog::Inst::opcode(local_20);
        std::ostream::operator<<(poVar2,IVar1);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
        return false;
      }
    }
    id = Prog::Inst::out(local_20);
    local_20 = Prog::inst((Prog *)this,id);
  } while( true );
}

Assistant:

static bool IsMatch(Prog* prog, Prog::Inst* ip) {
  for (;;) {
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "Unexpected opcode in IsMatch: " << ip->opcode();
        return false;

      case kInstAlt:
      case kInstAltMatch:
      case kInstByteRange:
      case kInstFail:
      case kInstEmptyWidth:
        return false;

      case kInstCapture:
      case kInstNop:
        ip = prog->inst(ip->out());
        break;

      case kInstMatch:
        return true;
    }
  }
}